

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O3

const_iterator __thiscall
phmap::priv::
base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
::find(base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
       *this,key_type *key)

{
  long lVar1;
  _Rb_tree_const_iterator<std::pair<const_long,_long>_> checker_iter;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  const_iterator tree_iter;
  const_iterator cVar5;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_const_std::pair<const_long,_long>_&,_const_std::pair<const_long,_long>_*>
  bVar4;
  
  tree_iter = btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
              ::find<long>((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                            *)this,key);
  p_Var2 = (this->checker_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  checker_iter._M_node = &(this->checker_)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var2 != (_Base_ptr)0x0) {
    lVar1 = *key;
    p_Var3 = checker_iter._M_node;
    do {
      if (lVar1 <= *(long *)(p_Var2 + 1)) {
        p_Var3 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[*(long *)(p_Var2 + 1) < lVar1];
    } while (p_Var2 != (_Base_ptr)0x0);
    if ((p_Var3 != checker_iter._M_node) && (*(long *)(p_Var3 + 1) <= lVar1)) {
      checker_iter._M_node = p_Var3;
    }
  }
  bVar4 = base_checker<phmap::btree_map<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>,std::map<long,long,std::less<long>,std::allocator<std::pair<long_const,long>>>>
          ::
          iter_check<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,false>>const,std::pair<long_const,long>const&,std::pair<long_const,long>const*>,std::_Rb_tree_const_iterator<std::pair<long_const,long>>>
                    ((base_checker<phmap::btree_map<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>,std::map<long,long,std::less<long>,std::allocator<std::pair<long_const,long>>>>
                      *)this,tree_iter,checker_iter);
  cVar5.node = bVar4.node;
  cVar5.position = bVar4.position;
  cVar5._12_4_ = bVar4._12_4_;
  return cVar5;
}

Assistant:

const_iterator find(const key_type &key) const {
        return iter_check(tree_.find(key), checker_.find(key));
    }